

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O3

int nn_recvmsg(int s,nn_msghdr *msghdr,int flags)

{
  nn_iovec *pnVar1;
  long lVar2;
  FILE *__stream;
  nn_sock *self;
  int iVar3;
  void *pvVar4;
  size_t sVar5;
  size_t sVar6;
  int *piVar7;
  char *pcVar8;
  long lVar9;
  void *pvVar10;
  ulong uVar11;
  ulong __n;
  ulong uVar12;
  size_t sStack_b0;
  void *ctrl;
  nn_sock *local_a0;
  nn_sock *sock;
  nn_msg msg;
  
  iVar3 = nn_global_hold_socket(&sock,s);
  if (iVar3 < 0) {
    piVar7 = __errno_location();
    *piVar7 = -iVar3;
  }
  else {
    if (msghdr == (nn_msghdr *)0x0) {
      iVar3 = -0x16;
    }
    else if (msghdr->msg_iovlen < 0) {
      iVar3 = -0x5a;
    }
    else {
      iVar3 = nn_sock_recv(sock,&msg,flags);
      if (-1 < iVar3) {
        local_a0 = sock;
        if ((msghdr->msg_iovlen == 1) && (msghdr->msg_iov->iov_len == 0xffffffffffffffff)) {
          pvVar4 = nn_chunkref_getchunk(&msg.body);
          *(void **)msghdr->msg_iov->iov_base = pvVar4;
          sStack_b0 = nn_chunk_size(pvVar4);
        }
        else {
          pvVar4 = nn_chunkref_data(&msg.body);
          sVar5 = nn_chunkref_size(&msg.body);
          if (msghdr->msg_iovlen != 0) {
            lVar9 = 8;
            uVar11 = 0;
            do {
              pnVar1 = msghdr->msg_iov;
              uVar12 = *(ulong *)((long)&pnVar1->iov_base + lVar9);
              if (uVar12 == 0xffffffffffffffff) {
                nn_msg_term(&msg);
                iVar3 = -0x16;
                sock = local_a0;
                goto LAB_0010f1e0;
              }
              pvVar10 = *(void **)((long)pnVar1 + lVar9 + -8);
              if (sVar5 < uVar12) {
                memcpy(pvVar10,pvVar4,sVar5);
                break;
              }
              memcpy(pvVar10,pvVar4,uVar12);
              lVar2 = *(long *)((long)&pnVar1->iov_base + lVar9);
              pvVar4 = (void *)((long)pvVar4 + lVar2);
              sVar5 = sVar5 - lVar2;
              uVar11 = uVar11 + 1;
              lVar9 = lVar9 + 0x10;
            } while (uVar11 != (uint)msghdr->msg_iovlen);
          }
          sStack_b0 = nn_chunkref_size(&msg.body);
        }
        if (msghdr->msg_control != (void *)0x0) {
          sVar5 = nn_chunkref_size(&msg.sphdr);
          uVar12 = sVar5 + 0xf & 0xfffffffffffffff8;
          sVar6 = nn_chunkref_size(&msg.hdrs);
          uVar11 = msghdr->msg_controllen;
          if (uVar11 == 0xffffffffffffffff) {
            uVar11 = uVar12 + sVar6 + 0x10;
            iVar3 = nn_chunk_alloc(uVar11,0,&ctrl);
            if (iVar3 != 0) {
              nn_backtrace_print();
              __stream = _stderr;
              pcVar8 = nn_err_strerror(-iVar3);
              fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar8,(ulong)(uint)-iVar3,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/core/global.c"
                      ,0x39a);
              fflush(_stderr);
              nn_err_abort();
            }
            *(void **)msghdr->msg_control = ctrl;
          }
          else {
            ctrl = msghdr->msg_control;
          }
          uVar12 = uVar12 + 0x10;
          if (uVar12 <= uVar11) {
            *(ulong *)ctrl = uVar12;
            *(undefined8 *)((long)ctrl + 8) = 0x100000001;
            *(size_t *)((long)ctrl + 0x10) = sVar5;
            pvVar10 = (void *)((long)ctrl + 0x18);
            pvVar4 = nn_chunkref_data(&msg.sphdr);
            memcpy(pvVar10,pvVar4,sVar5);
            sVar5 = nn_chunkref_size(&msg.hdrs);
            __n = uVar11 - uVar12;
            if (sVar5 < uVar11 - uVar12) {
              __n = sVar5;
            }
            pvVar10 = (void *)(uVar12 + (long)ctrl);
            pvVar4 = nn_chunkref_data(&msg.hdrs);
            memcpy(pvVar10,pvVar4,__n);
          }
        }
        nn_msg_term(&msg);
        self = local_a0;
        nn_sock_stat_increment(local_a0,0x12e,1);
        nn_sock_stat_increment(self,0x130,sStack_b0);
        nn_mutex_lock(&::self.lock);
        nn_sock_rele(self);
        nn_mutex_unlock(&::self.lock);
        goto LAB_0010f19c;
      }
    }
LAB_0010f1e0:
    nn_global_rele_socket(sock);
    piVar7 = __errno_location();
    *piVar7 = -iVar3;
  }
  sStack_b0 = 0xffffffffffffffff;
LAB_0010f19c:
  return (int)sStack_b0;
}

Assistant:

int nn_recvmsg (int s, struct nn_msghdr *msghdr, int flags)
{
    int rc;
    struct nn_msg msg;
    uint8_t *data;
    size_t sz;
    int i;
    struct nn_iovec *iov;
    void *chunk;
    size_t hdrssz;
    void *ctrl;
    size_t ctrlsz;
    size_t spsz;
    size_t sptotalsz;
    struct nn_cmsghdr *chdr;
    struct nn_sock *sock;

    rc = nn_global_hold_socket (&sock, s);
    if (nn_slow (rc < 0)) {
        errno = -rc;
        return -1;
    }

    if (nn_slow (!msghdr)) {
        rc = -EINVAL;
        goto fail;
    }

    if (nn_slow (msghdr->msg_iovlen < 0)) {
        rc = -EMSGSIZE;
        goto fail;
    }

    /*  Get a message. */
    rc = nn_sock_recv (sock, &msg, flags);
    if (nn_slow (rc < 0)) {
        goto fail;
    }

    if (msghdr->msg_iovlen == 1 && msghdr->msg_iov [0].iov_len == NN_MSG) {
        chunk = nn_chunkref_getchunk (&msg.body);
        *(void**) (msghdr->msg_iov [0].iov_base) = chunk;
        sz = nn_chunk_size (chunk);
    }
    else {

        /*  Copy the message content into the supplied gather array. */
        data = nn_chunkref_data (&msg.body);
        sz = nn_chunkref_size (&msg.body);
        for (i = 0; i != msghdr->msg_iovlen; ++i) {
            iov = &msghdr->msg_iov [i];
            if (nn_slow (iov->iov_len == NN_MSG)) {
                nn_msg_term (&msg);
                rc = -EINVAL;
                goto fail;
            }
            if (iov->iov_len > sz) {
                memcpy (iov->iov_base, data, sz);
                break;
            }
            memcpy (iov->iov_base, data, iov->iov_len);
            data += iov->iov_len;
            sz -= iov->iov_len;
        }
        sz = nn_chunkref_size (&msg.body);
    }

    /*  Retrieve the ancillary data from the message. */
    if (msghdr->msg_control) {

        spsz = nn_chunkref_size (&msg.sphdr);
        sptotalsz = NN_CMSG_SPACE (spsz+sizeof (size_t));
        ctrlsz = sptotalsz + nn_chunkref_size (&msg.hdrs);

        if (msghdr->msg_controllen == NN_MSG) {

            /* Allocate the buffer. */
            rc = nn_chunk_alloc (ctrlsz, 0, &ctrl);
            errnum_assert (rc == 0, -rc);

            /* Set output parameters. */
            *((void**) msghdr->msg_control) = ctrl;
        }
        else {

            /* Just use the buffer supplied by the user. */
            ctrl = msghdr->msg_control;
            ctrlsz = msghdr->msg_controllen;
        }

        /* If SP header alone won't fit into the buffer, return no ancillary
           properties. */
        if (ctrlsz >= sptotalsz) {
            char *ptr;

            /*  Fill in SP_HDR ancillary property. */
            chdr = (struct nn_cmsghdr*) ctrl;
            chdr->cmsg_len = sptotalsz;
            chdr->cmsg_level = PROTO_SP;
            chdr->cmsg_type = SP_HDR;
            ptr = (void *)chdr;
            ptr += sizeof (*chdr);
            *(size_t *)(void *)ptr = spsz;
            ptr += sizeof (size_t);
            memcpy (ptr, nn_chunkref_data (&msg.sphdr), spsz);

            /*  Fill in as many remaining properties as possible.
                Truncate the trailing properties if necessary. */
            hdrssz = nn_chunkref_size (&msg.hdrs);
            if (hdrssz > ctrlsz - sptotalsz)
                hdrssz = ctrlsz - sptotalsz;
            memcpy (((char*) ctrl) + sptotalsz,
                nn_chunkref_data (&msg.hdrs), hdrssz);
        }
    }

    nn_msg_term (&msg);

    /*  Adjust the statistics. */
    nn_sock_stat_increment (sock, NN_STAT_MESSAGES_RECEIVED, 1);
    nn_sock_stat_increment (sock, NN_STAT_BYTES_RECEIVED, sz);

    nn_global_rele_socket (sock);

    return (int) sz;

fail:
    nn_global_rele_socket (sock);

    errno = -rc;
    return -1;
}